

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall wallet::LegacyDataSPKM::AddInactiveHDChain(LegacyDataSPKM *this,CHDChain *chain)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int64_t iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  bool bVar7;
  mapped_type *pmVar8;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock31;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,
             &(this->super_FillableSigningProvider).cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,999,false);
  bVar7 = base_blob<160U>::IsNull((base_blob<160U> *)&chain->seed_id);
  if (bVar7) {
    __assert_fail("!chain.seed_id.IsNull()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,1000,"void wallet::LegacyDataSPKM::AddInactiveHDChain(const CHDChain &)");
  }
  pmVar8 = std::__detail::
           _Map_base<CKeyID,_std::pair<const_CKeyID,_wallet::CHDChain>,_std::allocator<std::pair<const_CKeyID,_wallet::CHDChain>_>,_std::__detail::_Select1st,_std::equal_to<CKeyID>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<CKeyID,_std::pair<const_CKeyID,_wallet::CHDChain>,_std::allocator<std::pair<const_CKeyID,_wallet::CHDChain>_>,_std::__detail::_Select1st,_std::equal_to<CKeyID>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->m_inactive_hd_chains,&chain->seed_id);
  pmVar8->nVersion = chain->nVersion;
  uVar5 = chain->nExternalChainCounter;
  uVar6 = chain->nInternalChainCounter;
  uVar1 = *(undefined8 *)(chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems;
  uVar2 = *(undefined8 *)((chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 8);
  uVar3 = *(undefined8 *)
           ((chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10);
  iVar4 = chain->m_next_internal_index;
  pmVar8->m_next_external_index = chain->m_next_external_index;
  pmVar8->m_next_internal_index = iVar4;
  *(undefined8 *)((pmVar8->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 8) = uVar2
  ;
  *(undefined8 *)((pmVar8->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10) =
       uVar3;
  pmVar8->nExternalChainCounter = uVar5;
  pmVar8->nInternalChainCounter = uVar6;
  *(undefined8 *)(pmVar8->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems = uVar1;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyDataSPKM::AddInactiveHDChain(const CHDChain& chain)
{
    LOCK(cs_KeyStore);
    assert(!chain.seed_id.IsNull());
    m_inactive_hd_chains[chain.seed_id] = chain;
}